

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  code *__pipedes;
  span<char> sVar2;
  span<int> sVar3;
  span<const_char> local_d0;
  int local_bc;
  queue **ppqStack_b8;
  int i;
  queue *raw;
  MyQueue qu;
  char local_72;
  undefined1 local_71 [9];
  pipe<char> cq;
  int local_54;
  pipe<int> local_50;
  pipe<int> iq;
  char local_38 [23];
  char local_21;
  pipe<char> local_20;
  pipe<char> p;
  char **argv_local;
  int argc_local;
  
  p._d._ref = (reference<mpt::pipe<char>::instance>)(reference<mpt::pipe<char>::instance>)argv;
  mtrace();
  mpt::pipe<char>::pipe(&local_20,(int *)0x0);
  local_21 = 'a';
  mpt::pipe<char>::push(&local_20,&local_21);
  local_38[3] = 0x6c;
  mpt::pipe<char>::push(&local_20,local_38 + 3);
  local_38[2] = 0x6c;
  mpt::pipe<char>::push(&local_20,local_38 + 2);
  local_38[1] = 0x6f;
  mpt::pipe<char>::push(&local_20,local_38 + 1);
  local_38[0] = 'h';
  mpt::pipe<char>::unshift(&local_20,local_38);
  sVar2 = mpt::pipe<char>::elements(&local_20);
  iq._d._ref = (reference<mpt::pipe<int>::instance>)sVar2._base;
  poVar1 = operator<<((ostream *)&std::cout,(span *)&iq);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_54 = 5;
  mpt::pipe<int>::pipe(&local_50,&local_54);
  sVar3 = mpt::pipe<int>::elements(&local_50);
  cq._d._ref = (reference<mpt::pipe<char>::instance>)sVar3._base;
  poVar1 = operator<<((ostream *)&std::cout,(span<int> *)&cq);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_71[0] = 0x61;
  mpt::pipe<char>::pipe((pipe<char> *)(local_71 + 1),(int *)local_71);
  local_72 = 'b';
  mpt::pipe<char>::push((pipe<char> *)(local_71 + 1),&local_72);
  sVar2 = mpt::pipe<char>::elements((pipe<char> *)(local_71 + 1));
  qu._32_8_ = sVar2._base;
  poVar1 = operator<<((ostream *)&std::cout,(span *)&qu.field_0x20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  MyQueue::MyQueue((MyQueue *)&raw);
  mpt::io::queue::prepare((ulong)&raw);
  ppqStack_b8 = &raw;
  (**(code **)(raw + 0x48))(ppqStack_b8,"hallo",5);
  MyQueue::add((MyQueue *)&raw,'{');
  for (local_bc = 1; local_bc < argc; local_bc = local_bc + 1) {
    MyQueue::add((MyQueue *)&raw,*(char **)((long)p._d._ref + (long)local_bc * 8),-1);
  }
  MyQueue::add((MyQueue *)&raw,'}');
  MyQueue::add((MyQueue *)&raw,"hallo",-1);
  MyQueue::add((MyQueue *)&raw,'t');
  mpt::io::queue::shift(&raw,0);
  mpt::io::queue::shift(&raw,0);
  local_d0 = MyQueue::string((MyQueue *)&raw);
  poVar1 = operator<<((ostream *)&std::cout,(span *)&local_d0);
  __pipedes = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  MyQueue::~MyQueue((MyQueue *)&raw);
  mpt::pipe<char>::~pipe((pipe<char> *)(local_71 + 1),(int *)__pipedes);
  mpt::pipe<int>::~pipe(&local_50,(int *)__pipedes);
  mpt::pipe<char>::~pipe(&local_20,(int *)__pipedes);
  return 0;
}

Assistant:

extern int main(int argc, char * const argv[])
{
	mtrace();
	
	mpt::pipe<char> p;
	p.push('a');
	p.push('l');
	p.push('l');
	p.push('o');
	p.unshift('h');
	std::cout << p.elements() << std::endl;
	
	
	mpt::pipe<int> iq(5, 8);
	std::cout << iq.elements() << std::endl;
	
	mpt::pipe<char> cq('a', 4);
	cq.push('b');
	std::cout << cq.elements() << std::endl;
	
	
	MyQueue qu;
	qu.prepare(456);
	mpt::io::queue *raw = &qu;
	
	raw->push("hallo", 5);
	
	qu.add('{');
	for (int i = 1; i < argc; ++i) {
		qu.add(argv[i]);
	}
	qu.add('}');
	qu.add("hallo");
	qu.add('t');
	qu.shift(0, 1);
	qu.shift(0, 1);
	
	std::cout << qu.string() << std::endl;
	
	return 0;
}